

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_420.cpp
# Opt level: O1

int __thiscall YUV420::ReadFromYUVFile(YUV420 *this,string *filename)

{
  uint8_t *puVar1;
  double dVar2;
  size_t sVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  undefined1 auVar11 [16];
  uint8_t temp;
  ifstream infile;
  uint8_t local_271;
  ulong local_270;
  size_t local_268;
  long local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  char local_238 [520];
  
  local_268 = this->width_;
  puVar1 = this->y_;
  puVar9 = this->u_;
  puVar10 = this->v_;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in|_S_bin|_S_ate);
  cVar4 = std::__basic_file<char>::is_open();
  iVar8 = -1;
  if (cVar4 != '\0') {
    local_240 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp:27:3)>
                ::_M_invoke;
    local_258._8_8_ = 0;
    local_248 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp:27:3)>
                ::_M_manager;
    local_258._M_unused._M_object = local_238;
    lVar5 = std::istream::tellg();
    std::istream::seekg((long)local_238,_S_beg);
    lVar6 = std::istream::tellg();
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this->size_;
    auVar11 = vpunpckldq_avx(auVar11,_DAT_001421b0);
    auVar11 = vsubpd_avx(auVar11,_DAT_001421c0);
    dVar2 = (auVar11._0_8_ + auVar11._8_8_) * 1.5;
    uVar7 = (ulong)dVar2;
    if (lVar5 - lVar6 != ((long)(dVar2 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7)) {
      __assert_fail("fsize == static_cast<size_t>(1.5 * size_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp"
                    ,0x20,"int YUV420::ReadFromYUVFile(const string &)");
    }
    std::istream::read(local_238,(long)puVar1);
    if (this->height_ != 0) {
      puVar9 = puVar9 + 1;
      local_260 = local_268 * 2;
      local_270 = 0;
      do {
        sVar3 = local_268;
        if (this->width_ != 0) {
          uVar7 = 0;
          do {
            std::istream::read(local_238,(long)&local_271);
            puVar9[uVar7 + sVar3] = local_271;
            puVar9[uVar7] = local_271;
            puVar9[uVar7 + (sVar3 - 1)] = local_271;
            puVar9[uVar7 - 1] = local_271;
            uVar7 = uVar7 + 2;
          } while (uVar7 < this->width_);
        }
        local_270 = local_270 + 2;
        puVar9 = puVar9 + local_260;
      } while (local_270 < this->height_);
    }
    if (this->height_ != 0) {
      puVar10 = puVar10 + 1;
      local_260 = local_268 * 2;
      local_270 = 0;
      do {
        sVar3 = local_268;
        if (this->width_ != 0) {
          uVar7 = 0;
          do {
            std::istream::read(local_238,(long)&local_271);
            puVar10[uVar7 + sVar3] = local_271;
            puVar10[uVar7] = local_271;
            puVar10[uVar7 + (sVar3 - 1)] = local_271;
            puVar10[uVar7 - 1] = local_271;
            uVar7 = uVar7 + 2;
          } while (uVar7 < this->width_);
        }
        local_270 = local_270 + 2;
        puVar10 = puVar10 + local_260;
      } while (local_270 < this->height_);
    }
    DeferredAction::~DeferredAction((DeferredAction *)&local_258);
    iVar8 = 0;
  }
  std::ifstream::~ifstream(local_238);
  return iVar8;
}

Assistant:

int YUV420::ReadFromYUVFile(const string &filename) {
  auto y = reinterpret_cast<uint8_t (*)[width_]>(y_);
  auto u = reinterpret_cast<uint8_t (*)[width_]>(u_);
  auto v = reinterpret_cast<uint8_t (*)[width_]>(v_);

  std::ifstream infile(filename, std::ifstream::in | std::ifstream::binary | std::ifstream::ate);
  if (!infile.is_open()){ return -1;}
  DEFER({infile.close();});

  std::streampos fsize = infile.tellg();
  infile.seekg(0, std::ifstream::beg);
  fsize = fsize - infile.tellg();
  assert(fsize == static_cast<size_t>(1.5 * size_));

  infile.read(reinterpret_cast<char *>(y), size_);
  for(size_t i = 0; i < height_; i+=2){
    for(size_t j = 0; j < width_; j+=2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      u[i][j] = u[i + 1][j] = u[i][j + 1] = u[i + 1][j + 1] = temp;
    }
  }

  for(size_t i = 0; i < height_; i += 2){
    for(size_t j = 0; j < width_; j += 2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      v[i][j] = v[i + 1][j] = v[i][j + 1] = v[i + 1][j + 1] = temp;
    }
  }
  return 0;
}